

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O2

SizeOp asmjit::v1_14::a64::armElementTypeToSizeOp
                 (uint32_t vecOpType,RegType regType,VecElementType elementType)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  
  if (0x16 < vecOpType) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64assembler.cpp"
               ,0x112,"vecOpType < InstDB::kVO_Count");
  }
  if (elementType < 8) {
    uVar2 = (ulong)vecOpType;
    uVar3 = 5;
    if (regType - 8 < 5) {
      uVar3 = regType - 8;
    }
    bVar1 = 0xff;
    if ((*(ushort *)(sizeOpMap + uVar2 * 4 + 2) >>
         ((byte)sizeOpTable
                [(ulong)(uVar3 << 3 | elementType) + (ulong)(byte)sizeOpMap[uVar2 * 4] * 0x28] &
         0x1f) & 1) != 0) {
      bVar1 = sizeOpMap[uVar2 * 4 + 1] &
              sizeOpTable
              [(ulong)(uVar3 << 3 | elementType) + (ulong)(byte)sizeOpMap[uVar2 * 4] * 0x28];
    }
    return (SizeOp)bVar1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/a64assembler.cpp"
             ,0x114,"uint32_t(elementType) <= 0x7u");
}

Assistant:

static inline SizeOp armElementTypeToSizeOp(uint32_t vecOpType, RegType regType, VecElementType elementType) noexcept {
  // Instruction data or Assembler is wrong if this triggers an assertion failure.
  ASMJIT_ASSERT(vecOpType < InstDB::kVO_Count);
  // ElementType uses 3 bits in the operand signature, it should never overflow.
  ASMJIT_ASSERT(uint32_t(elementType) <= 0x7u);

  const SizeOpMap& map = sizeOpMap[vecOpType];
  const SizeOpTable& table = sizeOpTable[map.tableId];

  size_t index = (Support::min<uint32_t>(diff(regType, RegType::kARM_VecB), diff(RegType::kARM_VecV, RegType::kARM_VecB) + 1) << 3) | uint32_t(elementType);
  SizeOp op = table.array[index];
  SizeOp modifiedOp { uint8_t(op.value & map.sizeOpMask) };

  if (!Support::bitTest(map.acceptMask, op.value))
    modifiedOp.makeInvalid();

  return modifiedOp;
}